

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

shared_ptr<spdlog::details::thread_pool> __thiscall
spdlog::details::registry::get_tp(registry *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::details::thread_pool> *in_RSI;
  element_type *in_RDI;
  shared_ptr<spdlog::details::thread_pool> sVar1;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_RSI,in_stack_ffffffffffffffc8);
  std::shared_ptr<spdlog::details::thread_pool>::shared_ptr
            (in_RSI,(shared_ptr<spdlog::details::thread_pool> *)in_stack_ffffffffffffffc8);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x6af8d3);
  sVar1.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI
  ;
  return (shared_ptr<spdlog::details::thread_pool>)
         sVar1.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<thread_pool> registry::get_tp() {
    std::lock_guard<std::recursive_mutex> lock(tp_mutex_);
    return tp_;
}